

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

void duckdb_je_tcache_bin_flush_large
               (tsd_t *tsd,tcache_t *tcache,cache_bin_t *cache_bin,szind_t binind,uint rem)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  ticker_geom_t *ptVar3;
  long *plVar4;
  char cVar5;
  uint64_t uVar6;
  edata_t *peVar7;
  tsd_t *tsdn;
  int iVar8;
  ulong uVar9;
  undefined8 *nflush;
  undefined8 *puVar10;
  uint i;
  ulong uVar11;
  ulong uVar12;
  void **ppvVar13;
  uint uVar14;
  uint uVar15;
  emap_batch_lookup_result_t *edatas;
  arena_t *paVar16;
  cache_bin_ptr_array_t local_b8;
  cache_bin_t *local_a8;
  arena_t *local_a0;
  long local_98;
  arena_stats_large_t *lstats;
  tcache_t *local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  tsd_t *local_68;
  arena_t *local_60;
  ulong local_58;
  long local_50;
  int local_44;
  undefined8 *local_40;
  uint local_34;
  
  edatas = (emap_batch_lookup_result_t *)0x0;
  local_88 = tcache;
  duckdb_je_tcache_bin_flush_stashed(tsd,tcache,cache_bin,binind,false);
  uVar15 = *(int *)&cache_bin->low_bits_empty - (int)cache_bin->stack_head & 0xffff;
  uVar14 = uVar15 >> 3;
  if (uVar14 < (rem & 0xffff)) {
    rem = uVar14;
  }
  uVar14 = uVar14 - rem & 0xffff;
  uVar11 = (ulong)uVar14;
  local_80 = (long)cache_bin->stack_head + ((ulong)uVar15 - (ulong)(uVar14 * 8));
  uVar14 = 0;
  local_50 = ((ulong)binind - 0x24) * 0x30;
  lstats = (arena_stats_large_t *)&local_b8;
  local_a8 = cache_bin;
  local_70 = uVar11;
  local_68 = tsd;
  do {
    uVar15 = (uint)uVar11 - uVar14;
    if (0xff < uVar15) {
      uVar15 = 0x100;
    }
    local_58 = (ulong)uVar15;
    local_b8.n = (cache_bin_sz_t)uVar15;
    local_b8.ptr = (void **)(local_80 + (ulong)uVar14 * 8);
    paVar16 = local_88->tcache_slow->arena;
    nflush = (undefined8 *)((long)lstats - (ulong)(uVar15 * 8 + 0x17 & 0x1ff0));
    local_40 = nflush;
    nflush[-1] = 0x11a8113;
    tcache_bin_flush_edatas_lookup(tsd,&local_b8,uVar15,(size_t)nflush,edatas);
    if ((uint)uVar11 == uVar14) {
LAB_011a8382:
      LOCK();
      plVar4 = (long *)((long)&(paVar16->stats).lstats[0].nrequests.val.repr + local_50);
      *plVar4 = *plVar4 + (cache_bin->tstats).nrequests;
      UNLOCK();
      LOCK();
      plVar4 = (long *)((long)&(paVar16->stats).lstats[0].nflushes.val.repr + local_50);
      *plVar4 = *plVar4 + 1;
      UNLOCK();
      (cache_bin->tstats).nrequests = 0;
    }
    else {
      local_98 = (long)&(paVar16->stats).lstats[0].nmalloc.val.repr + local_50;
      local_34 = 0;
      uVar11 = local_58 & 0xffffffff;
      puVar10 = local_40;
      local_78 = (ulong)uVar14;
      local_60 = paVar16;
      do {
        uVar14 = *(uint *)*puVar10 & 0xfff;
        paVar16 = (arena_t *)duckdb_je_arenas[uVar14].repr;
        if (paVar16 == (arena_t *)0x0) {
          paVar16 = (arena_t *)0x0;
        }
        if (duckdb_je_manual_arena_base <= paVar16->ind) {
          nflush[-1] = 0x11a818d;
          iVar8 = pthread_mutex_trylock
                            ((pthread_mutex_t *)((long)&(paVar16->large_mtx).field_0 + 0x48));
          if (iVar8 != 0) {
            nflush[-1] = 0x11a819d;
            duckdb_je_malloc_mutex_lock_slow(&paVar16->large_mtx);
            (paVar16->large_mtx).field_0.field_0.locked.repr = true;
          }
          puVar1 = &(paVar16->large_mtx).field_0.field_0.prof_data.n_lock_ops;
          *puVar1 = *puVar1 + 1;
          puVar10 = local_40;
          if (&((paVar16->large_mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
            *(tsd_t **)((long)&(paVar16->large_mtx).field_0 + 0x30) = tsd;
            ppwVar2 = &(paVar16->large_mtx).field_0.witness.link.qre_prev;
            *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
          }
        }
        if ((local_60 == paVar16) && ((local_34 & 1) == 0)) {
          uVar6 = (cache_bin->tstats).nrequests;
          LOCK();
          *(long *)(local_98 + 0x10) = *(long *)(local_98 + 0x10) + uVar6;
          UNLOCK();
          LOCK();
          *(long *)(local_98 + 0x20) = *(long *)(local_98 + 0x20) + 1;
          UNLOCK();
          (cache_bin->tstats).nrequests = 0;
          local_34 = (uint)CONCAT71((int7)(uVar6 >> 8),1);
        }
        local_44 = (int)uVar11;
        uVar9 = (ulong)(local_44 + (uint)(local_44 == 0));
        uVar11 = 0;
        do {
          peVar7 = (edata_t *)puVar10[uVar11];
          if (((uint)peVar7->e_bits & 0xfff) == uVar14) {
            nflush[-1] = 0x11a821e;
            duckdb_je_large_dalloc_prep_locked((tsdn_t *)tsd,peVar7);
            puVar10 = local_40;
          }
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
        if (duckdb_je_manual_arena_base <= paVar16->ind) {
          (paVar16->large_mtx).field_0.field_0.locked.repr = false;
          nflush[-1] = 0x11a8250;
          pthread_mutex_unlock((pthread_mutex_t *)((long)&(paVar16->large_mtx).field_0 + 0x48));
          puVar10 = local_40;
        }
        ppvVar13 = local_b8.ptr;
        uVar12 = 0;
        uVar11 = 0;
        local_a0 = paVar16;
        do {
          tsdn = local_68;
          peVar7 = (edata_t *)puVar10[uVar12];
          if (((uint)peVar7->e_bits & 0xfff) == uVar14) {
            nflush[-1] = 0x11a8282;
            duckdb_je_large_dalloc_finish((tsdn_t *)tsdn,peVar7);
            puVar10 = local_40;
          }
          else {
            ppvVar13[uVar11] = ppvVar13[uVar12];
            puVar10[uVar11] = peVar7;
            uVar11 = (ulong)((int)uVar11 + 1);
          }
          tsd = local_68;
          paVar16 = local_a0;
          cache_bin = local_a8;
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
        if (local_68 != (tsd_t *)0x0) {
          cVar5 = local_68->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
          ptVar3 = &local_68->
                    cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker;
          ptVar3->tick = ptVar3->tick + ((int)uVar11 - local_44);
          if (ptVar3->tick < 0) {
            if (cVar5 < '\x01') {
              uVar9 = local_68->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                      0x5851f42d4c957f2d + 0x14057b7ef767814f;
              local_68->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar9;
              (local_68->cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker).
              tick = (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar9 >> 0x3a] *
                               (long)(local_68->
                                     cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                                     ).nticks) / 0x3d);
              nflush[-1] = 0x11a8367;
              duckdb_je_arena_decay((tsdn_t *)tsd,paVar16,false,false);
              puVar10 = local_40;
            }
            else {
              (local_68->cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker).
              tick = 0;
            }
          }
        }
      } while ((int)uVar11 != 0);
      uVar14 = (uint)local_78;
      uVar11 = local_70;
      paVar16 = local_60;
      if ((local_34 & 1) == 0) goto LAB_011a8382;
    }
    uVar14 = (int)local_58 + uVar14;
    uVar15 = (uint)uVar11;
    if (uVar15 <= uVar14) {
      ppvVar13 = cache_bin->stack_head;
      iVar8 = *(int *)&cache_bin->low_bits_empty;
      lstats[-1].curlextents = 0x11a83e8;
      memmove((void *)((long)ppvVar13 + (ulong)(uVar15 * 8)),ppvVar13,
              (ulong)(((iVar8 - (int)ppvVar13 & 0xffffU) >> 3) - uVar15) << 3);
      ppvVar13 = (void **)((ulong)(uVar15 * 8) + (long)cache_bin->stack_head);
      cache_bin->stack_head = ppvVar13;
      if ((ushort)((*(int *)&cache_bin->low_bits_empty - (int)ppvVar13 & 0xffffU) >> 3) <
          (ushort)((short)*(int *)&cache_bin->low_bits_empty - cache_bin->low_bits_low_water) >> 3)
      {
        cache_bin->low_bits_low_water = (uint16_t)ppvVar13;
      }
      return;
    }
  } while( true );
}

Assistant:

void
tcache_bin_flush_large(tsd_t *tsd, tcache_t *tcache, cache_bin_t *cache_bin,
    szind_t binind, unsigned rem) {
	tcache_bin_flush_bottom(tsd, tcache, cache_bin, binind, rem,
	    /* small */ false);
}